

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O3

void __thiscall t_netstd_generator::generate_struct(t_netstd_generator *this,t_struct *tstruct)

{
  pointer pptVar1;
  
  pptVar1 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pptVar1 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      collect_extensions_types(this,(*pptVar1)->type_);
      pptVar1 = pptVar1 + 1;
    } while (pptVar1 !=
             (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if ((this->union_ == true) && (tstruct->is_union_ == true)) {
    generate_netstd_union(this,tstruct);
    return;
  }
  generate_netstd_struct(this,tstruct,false);
  return;
}

Assistant:

void t_netstd_generator::generate_struct(t_struct* tstruct)
{
    collect_extensions_types(tstruct);

    if (is_union_enabled() && tstruct->is_union())
    {
        generate_netstd_union(tstruct);
    }
    else
    {
        generate_netstd_struct(tstruct, false);
    }
}